

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathQuat.h
# Opt level: O3

Quat<float> * __thiscall
Imath_3_2::Quat<float>::setRotation(Quat<float> *this,Vec3<float> *from,Vec3<float> *to)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  float fVar31;
  undefined1 auVar30 [16];
  undefined1 auVar32 [16];
  undefined8 uVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar36;
  Vec3<float> local_98;
  float local_8c;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  
  fVar13 = from->z * from->z + from->x * from->x + from->y * from->y;
  if (fVar13 < 2.3509887e-38) {
    fVar13 = Vec3<float>::lengthTiny(from);
  }
  else {
    fVar13 = SQRT(fVar13);
  }
  fVar26 = 0.0;
  if ((fVar13 != 0.0) || (NAN(fVar13))) {
    uVar1 = from->x;
    uVar5 = from->y;
    auVar35._4_4_ = uVar5;
    auVar35._0_4_ = uVar1;
    auVar35._8_8_ = 0;
    auVar30._4_4_ = fVar13;
    auVar30._0_4_ = fVar13;
    auVar30._8_4_ = fVar13;
    auVar30._12_4_ = fVar13;
    auVar30 = divps(auVar35,auVar30);
    fVar26 = from->z / fVar13;
  }
  else {
    auVar30 = ZEXT816(0);
  }
  fVar13 = to->z * to->z + to->x * to->x + to->y * to->y;
  if (fVar13 < 2.3509887e-38) {
    local_78 = ZEXT416((uint)fVar26);
    local_88 = auVar30;
    fVar13 = Vec3<float>::lengthTiny(to);
    fVar26 = (float)local_78._0_4_;
    uVar27 = local_78._4_4_;
    uVar28 = local_78._8_4_;
    uVar29 = local_78._12_4_;
    auVar30 = local_88;
  }
  else {
    fVar13 = SQRT(fVar13);
    uVar27 = 0;
    uVar28 = 0;
    uVar29 = 0;
  }
  if ((fVar13 != 0.0) || (NAN(fVar13))) {
    uVar2 = to->x;
    uVar6 = to->y;
    auVar34._4_4_ = uVar6;
    auVar34._0_4_ = uVar2;
    auVar34._8_8_ = 0;
    auVar20._4_4_ = fVar13;
    auVar20._0_4_ = fVar13;
    auVar20._8_4_ = fVar13;
    auVar20._12_4_ = fVar13;
    auVar35 = divps(auVar34,auVar20);
    fVar13 = to->z / fVar13;
  }
  else {
    auVar35 = ZEXT816(0);
    fVar13 = 0.0;
  }
  fVar17 = auVar30._4_4_;
  local_98.x = auVar30._0_4_ + auVar35._0_4_;
  local_98.y = fVar17 + auVar35._4_4_;
  local_98.z = fVar26 + fVar13;
  local_38._0_4_ = local_98.z * local_98.z + local_98.x * local_98.x + local_98.y * local_98.y;
  if (0.0 <= fVar26 * fVar13 + auVar30._0_4_ * auVar35._0_4_ + fVar17 * auVar35._4_4_) {
    if ((float)local_38._0_4_ < 2.3509887e-38) {
      local_78._4_4_ = uVar27;
      local_78._0_4_ = fVar26;
      local_78._8_4_ = uVar28;
      local_78._12_4_ = uVar29;
      local_88 = auVar30;
      local_68 = fVar17;
      fStack_64 = fVar17;
      fStack_60 = fVar17;
      fStack_5c = fVar17;
      local_38._0_4_ = Vec3<float>::lengthTiny(&local_98);
    }
    else {
      local_38._0_4_ = SQRT((float)local_38._0_4_);
      local_68 = fVar17;
      local_78._0_4_ = fVar26;
      local_88._0_8_ = auVar30._0_8_;
    }
    fVar13 = 0.0;
    if (((float)local_38._0_4_ != 0.0) || (NAN((float)local_38._0_4_))) {
      fVar13 = local_98.x / (float)local_38._0_4_;
      auVar24._4_4_ = local_98.z;
      auVar24._0_4_ = local_98.y;
      auVar24._8_8_ = 0;
      auVar11._4_4_ = local_38._0_4_;
      auVar11._0_4_ = local_38._0_4_;
      auVar11._8_4_ = local_38._0_4_;
      auVar11._12_4_ = local_38._0_4_;
      auVar30 = divps(auVar24,auVar11);
      uVar19 = auVar30._0_8_;
    }
    else {
      uVar19 = 0;
    }
    fVar26 = (float)uVar19;
    fVar15 = (float)local_88._0_8_;
    fVar16 = (float)((ulong)local_88._0_8_ >> 0x20);
    fVar17 = (float)((ulong)uVar19 >> 0x20);
    this->r = fVar17 * (float)local_78._0_4_ + fVar15 * fVar13 + local_68 * fVar26;
    (this->v).x = fVar17 * fVar16 + -(float)local_78._0_4_ * fVar26;
    (this->v).y = fVar13 * (float)local_78._0_4_ + fVar17 * -fVar15;
    (this->v).z = fVar26 * fVar15 + fVar13 * -fVar16;
    return this;
  }
  if ((float)local_38._0_4_ < 2.3509887e-38) {
    local_78._4_4_ = uVar27;
    local_78._0_4_ = fVar26;
    local_78._8_4_ = uVar28;
    local_78._12_4_ = uVar29;
    local_8c = fVar13;
    local_88 = auVar30;
    local_68 = fVar17;
    fStack_64 = fVar17;
    fStack_60 = fVar17;
    fStack_5c = fVar17;
    local_28 = auVar35;
    local_38._0_4_ = Vec3<float>::lengthTiny(&local_98);
    fVar17 = local_68;
    fVar15 = fStack_64;
    fVar16 = fStack_60;
    fVar36 = fStack_5c;
    fVar26 = (float)local_78._0_4_;
    uVar27 = local_78._4_4_;
    uVar28 = local_78._8_4_;
    uVar29 = local_78._12_4_;
    auVar30 = local_88;
    auVar35 = local_28;
    fVar13 = local_8c;
  }
  else {
    local_38._0_4_ = SQRT((float)local_38._0_4_);
    fVar15 = fVar17;
    fVar16 = fVar17;
    fVar36 = fVar17;
  }
  if (((float)local_38._0_4_ != 0.0) || (NAN((float)local_38._0_4_))) {
    auVar32._4_4_ = local_98.y;
    auVar32._0_4_ = local_98.x;
    auVar32._8_8_ = 0;
    auVar21._4_4_ = local_38._0_4_;
    auVar21._0_4_ = local_38._0_4_;
    auVar21._8_4_ = local_38._0_4_;
    auVar21._12_4_ = local_38._0_4_;
    local_48 = divps(auVar32,auVar21);
    local_38._0_4_ = local_98.z / (float)local_38._0_4_;
  }
  else {
    local_48 = ZEXT816(0);
    local_38._0_4_ = 0.0;
  }
  local_38._12_4_ = 0;
  local_38._8_4_ = 0;
  local_38._4_4_ = 0;
  local_98.x = local_48._0_4_;
  local_58 = local_48._4_4_;
  fVar14 = (float)local_38._0_4_ * (float)local_38._0_4_ +
           local_98.x * local_98.x + local_58 * local_58;
  fVar31 = auVar30._0_4_;
  local_98.y = auVar30._4_4_;
  if ((fVar14 != 0.0) || (NAN(fVar14))) {
    local_98.z = fVar26 + (float)local_38._0_4_;
    local_98.x = fVar31 + local_98.x;
    local_98.y = local_98.y + local_58;
    fVar14 = local_98.z * local_98.z + local_98.x * local_98.x + local_98.y * local_98.y;
    fStack_54 = local_58;
    fStack_50 = local_58;
    fStack_4c = local_58;
    if (fVar14 < 2.3509887e-38) {
      local_78._4_4_ = uVar27;
      local_78._0_4_ = fVar26;
      local_78._8_4_ = uVar28;
      local_78._12_4_ = uVar29;
      local_38 = ZEXT416((uint)local_38._0_4_);
      local_8c = fVar13;
      local_88 = auVar30;
      local_68 = fVar17;
      fStack_64 = fVar15;
      fStack_60 = fVar16;
      fStack_5c = fVar36;
      local_28 = auVar35;
      fVar14 = Vec3<float>::lengthTiny(&local_98);
      fVar17 = local_68;
      fVar26 = (float)local_78._0_4_;
      fVar13 = local_8c;
      uVar19 = local_88._0_8_;
      uVar33 = local_28._0_8_;
    }
    else {
      fVar14 = SQRT(fVar14);
      uVar19 = auVar30._0_8_;
      uVar33 = auVar35._0_8_;
    }
    fVar15 = 0.0;
    if ((fVar14 != 0.0) || (NAN(fVar14))) {
      fVar15 = local_98.x / fVar14;
      auVar22._4_4_ = local_98.z;
      auVar22._0_4_ = local_98.y;
      auVar22._8_8_ = 0;
      auVar9._4_4_ = fVar14;
      auVar9._0_4_ = fVar14;
      auVar9._8_4_ = fVar14;
      auVar9._12_4_ = fVar14;
      auVar30 = divps(auVar22,auVar9);
      uVar18 = auVar30._0_8_;
    }
    else {
      uVar18 = 0;
    }
    fVar16 = (float)uVar18;
    fVar14 = (float)uVar19;
    fVar31 = (float)((ulong)uVar19 >> 0x20);
    fVar36 = (float)((ulong)uVar18 >> 0x20);
    this->r = fVar36 * fVar26 + fVar14 * fVar15 + fVar17 * fVar16;
    (this->v).x = fVar36 * fVar31 + -fVar26 * fVar16;
    (this->v).y = fVar15 * fVar26 + fVar36 * -fVar14;
    (this->v).z = fVar16 * fVar14 + fVar15 * -fVar31;
    local_98.z = fVar13 + (float)local_38._0_4_;
    local_98.x = (float)uVar33 + local_48._0_4_;
    local_98.y = (float)((ulong)uVar33 >> 0x20) + local_48._4_4_;
    fVar13 = local_98.z * local_98.z + local_98.x * local_98.x + local_98.y * local_98.y;
    if (fVar13 < 2.3509887e-38) {
      fVar13 = Vec3<float>::lengthTiny(&local_98);
    }
    else {
      fVar13 = SQRT(fVar13);
    }
    fVar26 = 0.0;
    if ((fVar13 != 0.0) || (NAN(fVar13))) {
      fVar26 = local_98.y / fVar13;
      auVar23._4_4_ = local_98.x;
      auVar23._0_4_ = local_98.z;
      auVar23._8_8_ = 0;
      auVar10._4_4_ = fVar13;
      auVar10._0_4_ = fVar13;
      auVar10._8_4_ = fVar13;
      auVar10._12_4_ = fVar13;
      auVar30 = divps(auVar23,auVar10);
      uVar19 = auVar30._0_8_;
    }
    else {
      uVar19 = 0;
    }
    fVar17 = (float)uVar19;
    fVar13 = (float)((ulong)uVar19 >> 0x20);
    fVar15 = (float)local_48._0_8_;
    fVar16 = (float)((ulong)local_48._0_8_ >> 0x20);
    fVar36 = (float)local_38._0_4_ * fVar17 + fVar13 * fVar15 + local_58 * fVar26;
    fVar14 = (float)local_38._0_4_ * fVar13 + -fVar15 * fVar17;
    fVar13 = fVar26 * fVar15 - fVar13 * fVar16;
    fVar26 = fVar17 * fVar16 - fVar26 * (float)local_38._0_4_;
    uVar3 = this->r;
    uVar7 = (this->v).x;
    uVar4 = (this->v).y;
    uVar8 = (this->v).z;
    (this->v).x = ((float)uVar4 * fVar13 - fVar14 * (float)uVar8) +
                  (float)uVar3 * fVar26 + (float)uVar7 * fVar36;
    (this->v).y = ((float)uVar8 * fVar26 - fVar13 * (float)uVar7) +
                  (float)uVar4 * fVar36 + (float)uVar3 * fVar14;
    (this->v).z = ((float)uVar7 * fVar14 - fVar26 * (float)uVar4) +
                  fVar13 * (float)uVar3 + fVar36 * (float)uVar8;
    this->r = (float)uVar3 * fVar36 -
              ((float)uVar8 * fVar13 + (float)uVar7 * fVar26 + fVar14 * (float)uVar4);
    return this;
  }
  this->r = 0.0;
  if ((local_98.y * local_98.y < fVar31 * fVar31) || (fVar26 * fVar26 < fVar31 * fVar31)) {
    if (fVar26 * fVar26 < local_98.y * local_98.y) {
      local_98.x = fVar17 - fVar26 * 0.0;
      local_98.y = fVar26 * 0.0 - fVar31;
      local_98.z = fVar31 * 0.0 + fVar17 * -0.0;
      fVar13 = local_98.z * local_98.z + local_98.x * local_98.x + local_98.y * local_98.y;
      goto LAB_001081f5;
    }
    local_98.x = fVar17 * 0.0 - fVar26;
    local_98.y = fVar26 * 0.0 + fVar31 * -0.0;
    local_98.z = fVar31 - fVar17 * 0.0;
    fVar13 = local_98.z * local_98.z + local_98.x * local_98.x + local_98.y * local_98.y;
    if (2.3509887e-38 <= fVar13) {
      fVar13 = SQRT(fVar13);
      goto LAB_0010825c;
    }
  }
  else {
    local_98.x = fVar17 * 0.0 + fVar26 * -0.0;
    local_98.y = fVar26 - fVar31 * 0.0;
    local_98.z = fVar31 * 0.0 - fVar17;
    fVar13 = local_98.z * local_98.z + local_98.x * local_98.x + local_98.y * local_98.y;
LAB_001081f5:
    if (2.3509887e-38 <= fVar13) {
      fVar13 = SQRT(fVar13);
      goto LAB_0010825c;
    }
  }
  fVar13 = Vec3<float>::lengthTiny(&local_98);
LAB_0010825c:
  fVar26 = 0.0;
  if ((fVar13 != 0.0) || (NAN(fVar13))) {
    auVar25._4_4_ = local_98.y;
    auVar25._0_4_ = local_98.x;
    auVar25._8_8_ = 0;
    auVar12._4_4_ = fVar13;
    auVar12._0_4_ = fVar13;
    auVar12._8_4_ = fVar13;
    auVar12._12_4_ = fVar13;
    auVar30 = divps(auVar25,auVar12);
    uVar19 = auVar30._0_8_;
    fVar26 = local_98.z / fVar13;
  }
  else {
    uVar19 = 0;
  }
  (this->v).x = (float)(int)uVar19;
  (this->v).y = (float)(int)((ulong)uVar19 >> 0x20);
  (this->v).z = fVar26;
  return this;
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 inline Quat<T>&
Quat<T>::setRotation (const Vec3<T>& from, const Vec3<T>& to) IMATH_NOEXCEPT
{
    //
    // Create a quaternion that rotates vector from into vector to,
    // such that the rotation is around an axis that is the cross
    // product of from and to.
    //
    // This function calls function setRotationInternal(), which is
    // numerically accurate only for rotation angles that are not much
    // greater than pi/2.  In order to achieve good accuracy for angles
    // greater than pi/2, we split large angles in half, and rotate in
    // two steps.
    //

    //
    // Normalize from and to, yielding f0 and t0.
    //

    Vec3<T> f0 = from.normalized ();
    Vec3<T> t0 = to.normalized ();

    if ((f0 ^ t0) >= 0)
    {
        //
        // The rotation angle is less than or equal to pi/2.
        //

        setRotationInternal (f0, t0, *this);
    }
    else
    {
        //
        // The angle is greater than pi/2.  After computing h0,
        // which is halfway between f0 and t0, we rotate first
        // from f0 to h0, then from h0 to t0.
        //

        Vec3<T> h0 = (f0 + t0).normalized ();

        if ((h0 ^ h0) != 0)
        {
            setRotationInternal (f0, h0, *this);

            Quat<T> q;
            setRotationInternal (h0, t0, q);

            *this *= q;
        }
        else
        {
            //
            // f0 and t0 point in exactly opposite directions.
            // Pick an arbitrary axis that is orthogonal to f0,
            // and rotate by pi.
            //

            r = T (0);

            Vec3<T> f02 = f0 * f0;

            if (f02.x <= f02.y && f02.x <= f02.z)
                v = (f0 % Vec3<T> (1, 0, 0)).normalized ();
            else if (f02.y <= f02.z)
                v = (f0 % Vec3<T> (0, 1, 0)).normalized ();
            else
                v = (f0 % Vec3<T> (0, 0, 1)).normalized ();
        }
    }

    return *this;
}